

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O1

void multikey_cache<4u,false>(Cacheblock<4U>_conflict *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  uchar *puVar8;
  uchar *puVar9;
  int iVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  uint32_t uVar14;
  Cacheblock<4U>_conflict *pCVar15;
  Cacheblock<4U>_conflict *pCVar16;
  ulong uVar17;
  Cacheblock<4U>_conflict *pCVar18;
  byte bVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  Cacheblock<4U>_conflict *pCVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  byte bVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  Cacheblock<4U>_conflict __tmp;
  
  if (N < 0x20) {
    if (N != 0) {
      if (1 < (long)N) {
        uVar24 = N & 0xffffffff;
        pCVar15 = cache;
        do {
          uVar3 = pCVar15[1].cached_bytes;
          uVar4 = *(undefined4 *)((long)&pCVar15[1].ptr + 4);
          uVar7 = *(undefined8 *)&pCVar15[1].field_0x4;
          pCVar15 = pCVar15 + 1;
          pCVar16 = pCVar15;
          while ((cache < pCVar16 && (uVar3 < pCVar16[-1].cached_bytes))) {
            pCVar18 = pCVar16 + -1;
            uVar13 = *(undefined4 *)&pCVar18->field_0x4;
            puVar8 = pCVar16[-1].ptr;
            pCVar16->cached_bytes = pCVar18->cached_bytes;
            *(undefined4 *)&pCVar16->field_0x4 = uVar13;
            pCVar16->ptr = puVar8;
            pCVar16 = pCVar18;
          }
          iVar10 = (int)uVar24;
          pCVar16->cached_bytes = uVar3;
          *(undefined8 *)&pCVar16->field_0x4 = uVar7;
          *(undefined4 *)((long)&pCVar16->ptr + 4) = uVar4;
          uVar24 = (ulong)(iVar10 - 1);
        } while (2 < iVar10);
      }
      if (N == 1) {
        lVar25 = 0;
        uVar24 = 1;
      }
      else {
        lVar27 = 0;
        lVar21 = 0;
        uVar26 = 1;
        do {
          lVar22 = lVar21 + 1;
          if (cache[lVar21].cached_bytes == cache[lVar22].cached_bytes) {
            uVar24 = uVar26 + 1;
            lVar25 = lVar27;
          }
          else {
            uVar24 = 1;
            lVar25 = lVar22;
            if ((1 < uVar26) && (1 < (int)uVar26 && (char)cache[lVar27].cached_bytes != '\0')) {
              pCVar15 = cache + lVar27;
              do {
                puVar8 = pCVar15[1].ptr;
                pCVar15 = pCVar15 + 1;
                for (pCVar16 = pCVar15; cache + lVar27 < pCVar16; pCVar16 = pCVar16 + -1) {
                  puVar9 = pCVar16[-1].ptr;
                  bVar19 = puVar9[depth + 4];
                  bVar28 = puVar8[depth + 4];
                  if ((bVar19 != 0) && (lVar21 = depth + 5, bVar19 == bVar28)) {
                    do {
                      bVar19 = puVar9[lVar21];
                      bVar28 = puVar8[lVar21];
                      if (bVar19 == 0) break;
                      lVar21 = lVar21 + 1;
                    } while (bVar19 == bVar28);
                  }
                  if (bVar19 <= bVar28) break;
                  pCVar16->ptr = puVar9;
                }
                iVar10 = (int)uVar26;
                pCVar16->ptr = puVar8;
                uVar26 = (ulong)(iVar10 - 1);
              } while (2 < iVar10);
            }
          }
          lVar27 = lVar25;
          lVar21 = lVar22;
          uVar26 = uVar24;
        } while (lVar22 != N - 1);
      }
      if (((1 < uVar24) && ((char)cache[lVar25].cached_bytes != '\0')) && (1 < (int)uVar24)) {
        pCVar15 = cache + lVar25;
        do {
          puVar8 = pCVar15[1].ptr;
          pCVar15 = pCVar15 + 1;
          for (pCVar16 = pCVar15; cache + lVar25 < pCVar16; pCVar16 = pCVar16 + -1) {
            puVar9 = pCVar16[-1].ptr;
            bVar19 = puVar9[depth + 4];
            bVar28 = puVar8[depth + 4];
            if ((bVar19 != 0) && (lVar27 = depth + 5, bVar19 == bVar28)) {
              do {
                bVar19 = puVar9[lVar27];
                bVar28 = puVar8[lVar27];
                if (bVar19 == 0) break;
                lVar27 = lVar27 + 1;
              } while (bVar19 == bVar28);
            }
            if (bVar19 <= bVar28) break;
            pCVar16->ptr = puVar9;
          }
          iVar10 = (int)uVar24;
          pCVar16->ptr = puVar8;
          uVar24 = (ulong)(iVar10 - 1);
        } while (2 < iVar10);
      }
    }
    return;
  }
  uVar24 = N >> 3;
  uVar3 = cache->cached_bytes;
  uVar5 = cache[uVar24].cached_bytes;
  pCVar15 = cache;
  if (uVar3 != uVar5) {
    pCVar15 = cache + (N >> 2);
    uVar6 = pCVar15->cached_bytes;
    if ((uVar6 != uVar3) && (uVar6 != uVar5)) {
      if (uVar3 < uVar5) {
        if (uVar6 <= uVar3) {
          pCVar15 = cache;
        }
        if (uVar5 < uVar6) {
          pCVar15 = cache + uVar24;
        }
      }
      else {
        if (uVar3 < uVar6) {
          pCVar15 = cache;
        }
        if (uVar6 < uVar5) {
          pCVar15 = cache + uVar24;
        }
      }
    }
  }
  uVar26 = N >> 1;
  pCVar16 = cache + (uVar26 - uVar24);
  uVar3 = cache[uVar26 - uVar24].cached_bytes;
  uVar5 = cache[uVar26].cached_bytes;
  pCVar18 = pCVar16;
  if (uVar3 != uVar5) {
    pCVar23 = cache + uVar26;
    pCVar18 = pCVar23 + uVar24;
    uVar6 = pCVar18->cached_bytes;
    if ((uVar6 != uVar3) && (uVar6 != uVar5)) {
      if (uVar3 < uVar5) {
        if (uVar3 < uVar6) {
          pCVar16 = pCVar18;
        }
        pCVar18 = pCVar16;
        if (uVar5 < uVar6) {
          pCVar18 = pCVar23;
        }
      }
      else {
        if (uVar3 < uVar6) {
          pCVar18 = pCVar16;
        }
        if (uVar6 < uVar5) {
          pCVar18 = pCVar23;
        }
      }
    }
  }
  lVar27 = (N - (N >> 2)) + -1;
  pCVar16 = cache + lVar27;
  lVar25 = (N - uVar24) + -1;
  uVar3 = cache[lVar27].cached_bytes;
  uVar5 = cache[lVar25].cached_bytes;
  pCVar23 = pCVar16;
  if (uVar3 != uVar5) {
    pCVar23 = cache + (N - 3);
    uVar6 = pCVar23->cached_bytes;
    if ((uVar6 != uVar3) && (uVar6 != uVar5)) {
      if (uVar3 < uVar5) {
        if (uVar3 < uVar6) {
          pCVar16 = pCVar23;
        }
        pCVar23 = pCVar16;
        if (uVar5 < uVar6) {
          pCVar23 = cache + lVar25;
        }
      }
      else {
        if (uVar3 < uVar6) {
          pCVar23 = pCVar16;
        }
        if (uVar6 < uVar5) {
          pCVar23 = cache + lVar25;
        }
      }
    }
  }
  uVar3 = pCVar15->cached_bytes;
  uVar5 = pCVar18->cached_bytes;
  pCVar16 = pCVar15;
  if (((uVar3 != uVar5) && (uVar6 = pCVar23->cached_bytes, pCVar16 = pCVar23, uVar6 != uVar3)) &&
     (uVar6 != uVar5)) {
    if (uVar3 < uVar5) {
      if (uVar3 < uVar6) {
        pCVar15 = pCVar23;
      }
      pCVar16 = pCVar15;
      if (uVar5 < uVar6) {
        pCVar16 = pCVar18;
      }
    }
    else {
      if (uVar3 < uVar6) {
        pCVar23 = pCVar15;
      }
      pCVar16 = pCVar23;
      if (uVar6 < uVar5) {
        pCVar16 = pCVar18;
      }
    }
  }
  uVar20 = N - 1;
  uVar14 = cache->cached_bytes;
  uVar13 = *(undefined4 *)&cache->field_0x4;
  puVar8 = cache->ptr;
  uVar4 = *(undefined4 *)&pCVar16->field_0x4;
  puVar9 = pCVar16->ptr;
  cache->cached_bytes = pCVar16->cached_bytes;
  *(undefined4 *)&cache->field_0x4 = uVar4;
  cache->ptr = puVar9;
  pCVar16->cached_bytes = uVar14;
  *(undefined4 *)&pCVar16->field_0x4 = uVar13;
  pCVar16->ptr = puVar8;
  uVar3 = cache->cached_bytes;
  uVar17 = 1;
  uVar26 = uVar20;
  uVar24 = uVar20;
  uVar30 = 1;
LAB_002246e5:
  uVar29 = uVar24;
  if (uVar17 <= uVar26) goto code_r0x002246ea;
  goto LAB_0022472b;
code_r0x002246ea:
  pCVar15 = cache + uVar17;
  uVar5 = cache[uVar17].cached_bytes;
  uVar31 = uVar30;
  if (uVar3 > uVar5 || uVar5 == uVar3) {
    if (uVar3 <= uVar5) {
      uVar31 = uVar30 + 1;
      pCVar16 = cache + uVar30;
      uVar14 = pCVar16->cached_bytes;
      uVar13 = *(undefined4 *)&pCVar16->field_0x4;
      puVar8 = pCVar16->ptr;
      uVar4 = *(undefined4 *)&pCVar15->field_0x4;
      puVar9 = pCVar15->ptr;
      pCVar16 = cache + uVar30;
      pCVar16->cached_bytes = pCVar15->cached_bytes;
      *(undefined4 *)&pCVar16->field_0x4 = uVar4;
      pCVar16->ptr = puVar9;
      pCVar15->cached_bytes = uVar14;
      *(undefined4 *)&pCVar15->field_0x4 = uVar13;
      pCVar15->ptr = puVar8;
    }
    uVar17 = uVar17 + 1;
  }
  uVar30 = uVar31;
  if (uVar3 < uVar5) {
LAB_0022472b:
    do {
      uVar24 = uVar29;
      if (uVar26 < uVar17) break;
      pCVar15 = cache + uVar26;
      uVar5 = cache[uVar26].cached_bytes;
      if (uVar3 <= uVar5) {
        if (uVar5 == uVar3) {
          uVar24 = uVar29 - 1;
          pCVar16 = cache + uVar29;
          uVar14 = pCVar16->cached_bytes;
          uVar13 = *(undefined4 *)&pCVar16->field_0x4;
          puVar8 = pCVar16->ptr;
          uVar4 = *(undefined4 *)&pCVar15->field_0x4;
          puVar9 = pCVar15->ptr;
          pCVar16 = cache + uVar29;
          pCVar16->cached_bytes = pCVar15->cached_bytes;
          *(undefined4 *)&pCVar16->field_0x4 = uVar4;
          pCVar16->ptr = puVar9;
          pCVar15->cached_bytes = uVar14;
          *(undefined4 *)&pCVar15->field_0x4 = uVar13;
          pCVar15->ptr = puVar8;
        }
        uVar26 = uVar26 - 1;
      }
      uVar29 = uVar24;
    } while (uVar3 <= uVar5);
    if (uVar26 < uVar17) {
      uVar20 = uVar20 - uVar24;
      uVar29 = uVar17 - uVar30;
      uVar24 = uVar24 - uVar26;
      uVar26 = uVar30;
      if (uVar29 < uVar30) {
        uVar26 = uVar29;
      }
      if (uVar26 != 0) {
        lVar25 = 0;
        do {
          puVar1 = (undefined8 *)((long)&cache->cached_bytes + lVar25);
          uVar7 = *puVar1;
          uVar11 = puVar1[1];
          puVar1 = (undefined8 *)((long)&cache[uVar17 - uVar26].cached_bytes + lVar25);
          uVar12 = puVar1[1];
          puVar2 = (undefined8 *)((long)&cache->cached_bytes + lVar25);
          *puVar2 = *puVar1;
          puVar2[1] = uVar12;
          puVar1 = (undefined8 *)((long)&cache[uVar17 - uVar26].cached_bytes + lVar25);
          *puVar1 = uVar7;
          puVar1[1] = uVar11;
          lVar25 = lVar25 + 0x10;
        } while (uVar26 * 0x10 != lVar25);
      }
      uVar26 = uVar20;
      if (uVar24 < uVar20) {
        uVar26 = uVar24;
      }
      if (uVar26 != 0) {
        lVar25 = 0;
        do {
          puVar1 = (undefined8 *)((long)&cache[uVar17].cached_bytes + lVar25);
          uVar7 = *puVar1;
          uVar11 = puVar1[1];
          puVar1 = (undefined8 *)((long)&cache[N - uVar26].cached_bytes + lVar25);
          uVar12 = puVar1[1];
          puVar2 = (undefined8 *)((long)&cache[uVar17].cached_bytes + lVar25);
          *puVar2 = *puVar1;
          puVar2[1] = uVar12;
          puVar1 = (undefined8 *)((long)&cache[N - uVar26].cached_bytes + lVar25);
          *puVar1 = uVar7;
          puVar1[1] = uVar11;
          lVar25 = lVar25 + 0x10;
        } while (uVar26 * 0x10 != lVar25);
      }
      multikey_cache<4u,false>(cache,uVar29,depth);
      multikey_cache<4u,false>(cache + uVar29 + uVar30 + uVar20,uVar24,depth);
      if ((char)uVar3 == '\0') {
        return;
      }
      multikey_cache<4u,true>(cache + uVar29,uVar30 + uVar20,depth + 4);
      return;
    }
    pCVar15 = cache + uVar17;
    uVar14 = pCVar15->cached_bytes;
    uVar13 = *(undefined4 *)&pCVar15->field_0x4;
    puVar8 = pCVar15->ptr;
    pCVar15 = cache + uVar26;
    uVar4 = *(undefined4 *)&pCVar15->field_0x4;
    puVar9 = pCVar15->ptr;
    pCVar16 = cache + uVar17;
    pCVar16->cached_bytes = pCVar15->cached_bytes;
    *(undefined4 *)&pCVar16->field_0x4 = uVar4;
    pCVar16->ptr = puVar9;
    pCVar15 = cache + uVar26;
    pCVar15->cached_bytes = uVar14;
    *(undefined4 *)&pCVar15->field_0x4 = uVar13;
    pCVar15->ptr = puVar8;
    uVar17 = uVar17 + 1;
    uVar26 = uVar26 - 1;
  }
  goto LAB_002246e5;
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}